

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O0

void __thiscall WDL_Resampler::SetRates(WDL_Resampler *this,int rate_in,int rate_out)

{
  bool bVar1;
  Fraction local_28;
  Fraction local_20;
  int local_18;
  int local_14;
  int rate_out_local;
  int rate_in_local;
  WDL_Resampler *this_local;
  
  local_14 = rate_in;
  if (rate_in < 1) {
    local_14 = 1;
  }
  local_18 = rate_out;
  if (rate_out < 1) {
    local_18 = 1;
  }
  _rate_out_local = this;
  Fraction::Fraction(&local_20,local_14,local_18);
  bVar1 = Fraction::operator!=(&this->m_ratio,local_20);
  if (bVar1) {
    Fraction::Fraction(&local_28,local_14,local_18);
    this->m_ratio = local_28;
    this->m_sinc_ideal_calced = -1;
  }
  return;
}

Assistant:

void WDL_Resampler::SetRates(double rate_in, double rate_out) 
#endif
{
  if (rate_in<1) rate_in=1;
  if (rate_out<1) rate_out=1;
#ifdef WDL_RESAMPLE_RATIONAL
  if (m_ratio != Fraction(rate_in, rate_out))
  {
    m_ratio=Fraction(rate_in, rate_out);
    m_sinc_ideal_calced = -1;
  }
#else
  if (rate_in != m_sratein || rate_out != m_srateout)
  {
    m_sratein=rate_in; 
    m_srateout=rate_out;  
    m_ratio=m_sratein / m_srateout;
    m_sinc_ideal_calced = -1;
  }
#endif
}